

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O3

string * __thiscall
mbc::Val::Person::str_width_abi_cxx11_(string *__return_storage_ptr__,Person *this,int width)

{
  string *psVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  size_type *local_d0;
  string body_string;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  if (*(this->super_ValBase).is_vaild_ != true) {
    psVar1 = (this->super_ValBase).invaild_waring_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar1->_M_string_length);
    return __return_storage_ptr__;
  }
  ValBase::str_abi_cxx11_(&local_370,(ValBase *)this->name_);
  std::operator+(&local_350,"name: ",&local_370);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_350);
  local_f0 = &local_e0;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_e0 = *plVar6;
    lStack_d8 = plVar4[3];
  }
  else {
    local_e0 = *plVar6;
    local_f0 = (long *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ValBase::str_abi_cxx11_(&local_310,(ValBase *)this->sex_);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)local_310._M_dataplus._M_p);
  local_190 = &local_180;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_180 = *plVar6;
    lStack_178 = plVar4[3];
  }
  else {
    local_180 = *plVar6;
    local_190 = (long *)*plVar4;
  }
  local_188 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
  local_110 = &local_100;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_100 = *plVar6;
    lStack_f8 = plVar4[3];
  }
  else {
    local_100 = *plVar6;
    local_110 = (long *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ValBase::str_abi_cxx11_(&local_2f0,(ValBase *)this->telephone_);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)local_2f0._M_dataplus._M_p);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_1e0 = *plVar6;
    lStack_1d8 = plVar4[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar6;
    local_1f0 = (long *)*plVar4;
  }
  local_1e8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  local_130 = &local_120;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_120 = *plVar6;
    lStack_118 = plVar4[3];
  }
  else {
    local_120 = *plVar6;
    local_130 = (long *)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ValBase::str_abi_cxx11_(&local_2d0,(ValBase *)this->mail_number_);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)local_2d0._M_dataplus._M_p);
  local_1b0 = &local_1a0;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_1a0 = *plVar6;
    lStack_198 = plVar4[3];
  }
  else {
    local_1a0 = *plVar6;
    local_1b0 = (long *)*plVar4;
  }
  local_1a8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_150 = &local_140;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_140 = *plVar6;
    lStack_138 = plVar4[3];
  }
  else {
    local_140 = *plVar6;
    local_150 = (long *)*plVar4;
  }
  local_148 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ValBase::str_abi_cxx11_(&local_2b0,(ValBase *)this->email_);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_150,(ulong)local_2b0._M_dataplus._M_p);
  local_1d0 = &local_1c0;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_1c0 = *plVar6;
    lStack_1b8 = plVar4[3];
  }
  else {
    local_1c0 = *plVar6;
    local_1d0 = (long *)*plVar4;
  }
  local_1c8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_170 = &local_160;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_160 = *plVar6;
    lStack_158 = plVar4[3];
  }
  else {
    local_160 = *plVar6;
    local_170 = (long *)*plVar4;
  }
  local_168 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ValBase::str_abi_cxx11_(&local_290,(ValBase *)this->qq_number_);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_170,(ulong)local_290._M_dataplus._M_p);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_a0._M_allocated_capacity = *puVar7;
    local_a0._8_8_ = plVar4[3];
    body_string.field_2._8_8_ = &local_a0;
  }
  else {
    local_a0._M_allocated_capacity = *puVar7;
    body_string.field_2._8_8_ = (ulong *)*plVar4;
  }
  lVar3 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(body_string.field_2._M_local_buf + 8);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_70.field_2._M_allocated_capacity = *psVar8;
    local_70.field_2._8_8_ = plVar4[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar8;
    local_70._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ValBase::str_abi_cxx11_(&local_270,(ValBase *)this->location_);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)local_270._M_dataplus._M_p);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_90.field_2._M_allocated_capacity = *psVar8;
    local_90.field_2._8_8_ = plVar4[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar8;
    local_90._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_50 = &local_40;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_40 = *puVar7;
    lStack_38 = plVar4[3];
  }
  else {
    local_40 = *puVar7;
    local_50 = (ulong *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ValBase::str_abi_cxx11_(&local_250,(ValBase *)this->classes_);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)local_250._M_dataplus._M_p);
  local_d0 = &body_string._M_string_length;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    body_string._M_string_length = *psVar8;
    body_string.field_2._M_allocated_capacity = plVar4[3];
  }
  else {
    body_string._M_string_length = *psVar8;
    local_d0 = (size_type *)*plVar4;
  }
  body_string._M_dataplus._M_p = (pointer)plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)body_string.field_2._8_8_ != &local_a0) {
    operator_delete((void *)body_string.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  ValBase::str_abi_cxx11_(&local_70,(ValBase *)this->ID_);
  std::operator+(&local_90,"+------| id: ",&local_70);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_40 = *puVar7;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar7;
    local_50 = (ulong *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_d0,body_string._M_dataplus._M_p + (long)local_d0);
  units::hard_warp(&local_330,&local_230,width);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"| ","");
  units::add_head((string *)((long)&body_string.field_2 + 8),&local_330,&local_210);
  uVar9 = 0xf;
  if (local_50 != &local_40) {
    uVar9 = local_40;
  }
  if (uVar9 < (ulong)(lVar3 + local_48)) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)body_string.field_2._8_8_ != &local_a0) {
      uVar10 = local_a0._M_allocated_capacity;
    }
    if ((ulong)(lVar3 + local_48) <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)((long)&body_string.field_2 + 8),0,(char *)0x0,(ulong)local_50);
      goto LAB_00122f22;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_50,body_string.field_2._8_8_);
LAB_00122f22:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar8) {
    uVar10 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)body_string.field_2._8_8_ != &local_a0) {
    operator_delete((void *)body_string.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_d0 != &body_string._M_string_length) {
    operator_delete(local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

const string Person::str_width(int width) const {
    if (*is_vaild_) {
		string body_string =
			"name: " + name_->str() + ", sex: " + sex_->str() + ", telephone: " +
			telephone_->str() + ", mail_number: " + mail_number_->str() + ", email:" +
			email_->str() + ", qq_number: " + qq_number_->str() + ", location: " +
			location_->str() + ", classes: " + classes_->str();
		return "+------| id: " + ID_->str() + " |------\n"
			   + units::add_head(units::hard_warp(body_string, width), "| ");
    } else {
        return *invaild_waring_;
    }
}